

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O1

void __thiscall QFontCache::timerEvent(QFontCache *this,QTimerEvent *param_1)

{
  if (this->max_cost < 0x1001 && this->total_cost <= this->max_cost) {
    QBasicTimer::stop();
    this->fast = false;
    return;
  }
  decreaseCache(this);
  return;
}

Assistant:

void QFontCache::timerEvent(QTimerEvent *)
{
    FC_DEBUG("QFontCache::timerEvent: performing cache maintenance (timestamp %u)",
              current_timestamp);

    if (total_cost <= max_cost && max_cost <= min_cost) {
        FC_DEBUG("  cache redused sufficiently, stopping timer");

        timer.stop();
        fast = false;

        return;
    }
    decreaseCache();
}